

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

UA_StatusCode HelAckHandshake(UA_Client *client)

{
  UA_Connection *connection;
  UA_Byte **offset;
  UA_StatusCode UVar1;
  UA_StatusCode UVar2;
  char *msg;
  UA_Logger logger;
  UA_Byte *pUVar3;
  undefined8 uStack_b8;
  UA_TcpHelloMessage hello;
  UA_ByteString local_88;
  UA_UInt32 local_74;
  uint local_70;
  UA_TcpAcknowledgeMessage ackMessage;
  UA_TcpMessageHeader messageHeader;
  undefined1 local_48 [8];
  UA_ByteString message;
  UA_Boolean realloced;
  
  connection = &client->connection;
  UVar1 = (*(client->connection).getSendBuffer)(connection,0x2000,(UA_ByteString *)local_48);
  if (UVar1 == 0) {
    UA_copy(&client->endpointUrl,&hello.maxChunkCount,UA_TYPES + 0xb);
    hello.sendBufferSize = (client->connection).localConf.maxChunkCount;
    uStack_b8 = CONCAT44((client->connection).localConf.recvBufferSize,
                         (client->connection).localConf.protocolVersion);
    hello.receiveBufferSize = (client->connection).localConf.maxMessageSize;
    hello.protocolVersion = (client->connection).localConf.sendBufferSize;
    pos = (UA_Byte *)(message.length + 8);
    end = (UA_Byte *)(message.length + (long)local_48);
    exchangeBufferCallback = (UA_exchangeEncodeBuffer)0x0;
    exchangeBufferCallbackHandle = (void *)0x0;
    encodeBuf = (UA_ByteString *)local_48;
    UVar2 = UA_encodeBinaryInternal(&uStack_b8,UA_TRANSPORT + 2);
    pUVar3 = pos + -message.length;
    hello.endpointUrl.data = pUVar3;
    deleteMembers_noInit(&uStack_b8,UA_TRANSPORT + 2);
    hello.endpointUrl.length = 0;
    hello.sendBufferSize = 0;
    hello.maxMessageSize = 0;
    hello.maxChunkCount = 0;
    hello._20_4_ = 0;
    uStack_b8 = 0;
    hello.protocolVersion = 0;
    hello.receiveBufferSize = 0;
    ackMessage.maxMessageSize = 0x464c4548;
    ackMessage.maxChunkCount = (UA_UInt32)pUVar3;
    pos = (UA_Byte *)message.length;
    end = (UA_Byte *)(message.length + (long)local_48);
    encodeBuf = (UA_ByteString *)local_48;
    exchangeBufferCallback = (UA_exchangeEncodeBuffer)0x0;
    exchangeBufferCallbackHandle = (void *)0x0;
    UVar1 = UA_encodeBinaryInternal(&ackMessage.maxMessageSize,UA_TRANSPORT + 8);
    UVar1 = UVar1 | UVar2;
    if (UVar1 == 0) {
      local_48 = (undefined1  [8])(ulong)ackMessage.maxChunkCount;
      UVar1 = (*(client->connection).send)(connection,(UA_ByteString *)local_48);
      if (UVar1 == 0) {
        local_88.length = 0;
        local_88.data = (UA_Byte *)0x0;
        message.data._7_1_ = '\0';
        UVar1 = UA_Connection_receiveChunksBlocking
                          (connection,&local_88,(UA_Boolean *)((long)&message.data + 7),
                           (client->config).timeout);
        if (UVar1 == 0) {
          offset = &hello.endpointUrl.data;
          hello.endpointUrl.data = (UA_Byte *)0x0;
          UVar2 = UA_decodeBinary(&local_88,(size_t *)offset,&ackMessage.maxMessageSize,
                                  UA_TRANSPORT + 8);
          UVar1 = UA_decodeBinary(&local_88,(size_t *)offset,&local_74,UA_TRANSPORT + 6);
          UVar1 = UVar1 | UVar2;
          if (message.data._7_1_ == '\0') {
            (*(client->connection).releaseRecvBuffer)(connection,&local_88);
          }
          else {
            deleteMembers_noInit(&local_88,UA_TYPES + 0xe);
            local_88.length = 0;
            local_88.data = (UA_Byte *)0x0;
          }
          if (UVar1 == 0) {
            (client->connection).remoteConf.maxChunkCount = ackMessage.sendBufferSize;
            (client->connection).remoteConf.maxMessageSize = ackMessage.receiveBufferSize;
            (client->connection).remoteConf.protocolVersion = local_74;
            (client->connection).remoteConf.sendBufferSize = ackMessage.protocolVersion;
            (client->connection).remoteConf.recvBufferSize = local_70;
            if (local_70 < (client->connection).localConf.sendBufferSize) {
              (client->connection).localConf.sendBufferSize = local_70;
            }
            if (ackMessage.protocolVersion < (client->connection).localConf.recvBufferSize) {
              (client->connection).localConf.recvBufferSize = ackMessage.protocolVersion;
            }
            connection->state = UA_CONNECTION_ESTABLISHED;
            return 0;
          }
          logger = (client->config).logger;
          msg = "Decoding ACK message failed";
        }
        else {
          logger = (client->config).logger;
          msg = "Receiving ACK message failed";
        }
      }
      else {
        logger = (client->config).logger;
        msg = "Sending HEL failed";
      }
      UA_LOG_INFO(logger,UA_LOGCATEGORY_NETWORK,msg);
    }
    else {
      (*(client->connection).releaseSendBuffer)(connection,(UA_ByteString *)local_48);
    }
  }
  return UVar1;
}

Assistant:

static UA_StatusCode
HelAckHandshake(UA_Client *client) {
    /* Get a buffer */
    UA_ByteString message;
    UA_Connection *conn = &client->connection;
    UA_StatusCode retval = conn->getSendBuffer(conn, UA_MINMESSAGESIZE, &message);
    if(retval != UA_STATUSCODE_GOOD)
        return retval;

    /* Prepare the HEL message and encode at offset 8 */
    UA_TcpHelloMessage hello;
    UA_String_copy(&client->endpointUrl, &hello.endpointUrl); /* must be less than 4096 bytes */
    hello.maxChunkCount = conn->localConf.maxChunkCount;
    hello.maxMessageSize = conn->localConf.maxMessageSize;
    hello.protocolVersion = conn->localConf.protocolVersion;
    hello.receiveBufferSize = conn->localConf.recvBufferSize;
    hello.sendBufferSize = conn->localConf.sendBufferSize;

    size_t offset = 8;
    retval = UA_TcpHelloMessage_encodeBinary(&hello, &message, &offset);
    UA_TcpHelloMessage_deleteMembers(&hello);

    /* Encode the message header at offset 0 */
    UA_TcpMessageHeader messageHeader;
    messageHeader.messageTypeAndChunkType = UA_CHUNKTYPE_FINAL + UA_MESSAGETYPE_HEL;
    messageHeader.messageSize = (UA_UInt32)offset;
    offset = 0;
    retval |= UA_TcpMessageHeader_encodeBinary(&messageHeader, &message, &offset);
    if(retval != UA_STATUSCODE_GOOD) {
        conn->releaseSendBuffer(conn, &message);
        return retval;
    }

    /* Send the HEL message */
    message.length = messageHeader.messageSize;
    retval = conn->send(conn, &message);
    if(retval != UA_STATUSCODE_GOOD) {
        UA_LOG_INFO(client->config.logger, UA_LOGCATEGORY_NETWORK,
                    "Sending HEL failed");
        return retval;
    }
    UA_LOG_DEBUG(client->config.logger, UA_LOGCATEGORY_NETWORK,
                 "Sent HEL message");

    /* Loop until we have a complete chunk */
    UA_ByteString reply = UA_BYTESTRING_NULL;
    UA_Boolean realloced = false;
    retval = UA_Connection_receiveChunksBlocking(conn, &reply, &realloced,
                                                 client->config.timeout);
    if(retval != UA_STATUSCODE_GOOD) {
        UA_LOG_INFO(client->config.logger, UA_LOGCATEGORY_NETWORK,
                    "Receiving ACK message failed");
        return retval;
    }

    /* Decode the message */
    offset = 0;
    UA_TcpAcknowledgeMessage ackMessage;
    retval = UA_TcpMessageHeader_decodeBinary(&reply, &offset, &messageHeader);
    retval |= UA_TcpAcknowledgeMessage_decodeBinary(&reply, &offset, &ackMessage);

    /* Free the message buffer */
    if(!realloced)
        conn->releaseRecvBuffer(conn, &reply);
    else
        UA_ByteString_deleteMembers(&reply);

    /* Store remote connection settings and adjust local configuration to not
       exceed the limits */
    if(retval == UA_STATUSCODE_GOOD) {
        UA_LOG_DEBUG(client->config.logger, UA_LOGCATEGORY_NETWORK, "Received ACK message");
        conn->remoteConf.maxChunkCount = ackMessage.maxChunkCount; /* may be zero -> unlimited */
        conn->remoteConf.maxMessageSize = ackMessage.maxMessageSize; /* may be zero -> unlimited */
        conn->remoteConf.protocolVersion = ackMessage.protocolVersion;
        conn->remoteConf.sendBufferSize = ackMessage.sendBufferSize;
        conn->remoteConf.recvBufferSize = ackMessage.receiveBufferSize;
        if(conn->remoteConf.recvBufferSize < conn->localConf.sendBufferSize)
            conn->localConf.sendBufferSize = conn->remoteConf.recvBufferSize;
        if(conn->remoteConf.sendBufferSize < conn->localConf.recvBufferSize)
            conn->localConf.recvBufferSize = conn->remoteConf.sendBufferSize;
        conn->state = UA_CONNECTION_ESTABLISHED;
    } else {
        UA_LOG_INFO(client->config.logger, UA_LOGCATEGORY_NETWORK, "Decoding ACK message failed");
    }
    UA_TcpAcknowledgeMessage_deleteMembers(&ackMessage);

    return retval;
}